

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderAtomicOrCase::verify
          (ShaderAtomicOrCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  uint uVar2;
  Precision PVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  undefined1 uVar15;
  uint uVar16;
  undefined8 unaff_R14;
  ulong uVar17;
  int in_stack_00000008;
  long in_stack_00000010;
  ulong local_1d8;
  Hex<8UL> local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  lVar7 = 0;
  uVar10 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  do {
    uVar9 = uVar10;
    uVar2 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[lVar7 + 1];
    uVar10 = uVar2 * uVar9;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  local_1b8 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
              (long)(int)uVar10;
  PVar3 = (this->super_ShaderAtomicOpCase).m_precision;
  uVar6 = 0xff;
  if (PVar3 == PRECISION_MEDIUMP) {
    uVar6 = 0xffff;
  }
  if ((this->super_ShaderAtomicOpCase).m_type == TYPE_UINT) {
    uVar6 = 0xffffffff;
  }
  if (PVar3 == PRECISION_HIGHP) {
    uVar6 = 0xffffffff;
  }
  iVar12 = (int)local_1b8;
  uVar17 = CONCAT71((int7)((ulong)unaff_R14 >> 8),iVar12 < 1);
  iVar11 = (int)uVar17;
  if (0 < iVar12) {
    uVar4 = (this->super_ShaderAtomicOpCase).m_initialValue;
    local_1b8 = local_1b8 & 0xffffffff;
    iVar12 = 0;
    iVar5 = 0;
    local_1d8 = 0;
    do {
      iVar11 = (int)uVar17;
      uVar13 = (ulong)uVar10;
      uVar14 = uVar4;
      iVar8 = iVar5;
      if (0 < (int)uVar10) {
        do {
          uVar14 = uVar14 | *(uint *)(siglen + (long)iVar8);
          iVar8 = iVar8 + (int)sig;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      iVar8 = (int)local_1d8;
      uVar16 = *(uint *)(in_stack_00000010 + iVar8 * in_stack_00000008);
      if (((uVar16 ^ uVar14) & uVar6) != 0) {
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: at group ",0x10);
        std::ostream::operator<<(poVar1,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": expected ",0xb);
        local_1c0.value = (deUint64)uVar14;
        tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
        local_1c0.value = (ulong)uVar16;
        tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0149a9e4:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        return iVar11;
      }
      uVar15 = (undefined1)uVar17;
      if (0 < (int)uVar10) {
        uVar13 = 0;
        iVar11 = iVar12;
        do {
          uVar14 = *(uint *)(tbslen + (long)iVar11);
          uVar16 = uVar14 & uVar6;
          uVar17 = (ulong)uVar16;
          if ((uVar16 & uVar4) == 0) {
            local_1b0._0_8_ =
                 ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"ERROR: at group ",0x10);
            iVar11 = CONCAT31((int3)(uVar16 >> 8),uVar15);
            std::ostream::operator<<(poVar1,iVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,", invocation ",0xd);
            std::ostream::operator<<(poVar1,(int)uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,": found unexpected value ",0x19);
            local_1c0.value = (ulong)uVar14;
            tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0149a9e4;
          }
          uVar13 = uVar13 + 1;
          iVar11 = iVar11 + (int)tbs;
        } while (uVar10 != uVar13);
      }
      local_1d8 = local_1d8 + 1;
      uVar17 = CONCAT71((int7)(uVar17 >> 8),local_1b8 <= local_1d8);
      iVar11 = (int)uVar17;
      iVar5 = iVar5 + (int)sig * uVar9 * uVar2;
      iVar12 = iVar12 + uVar9 * (int)tbs * uVar2;
    } while (local_1d8 != local_1b8);
  }
  return iVar11;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= (m_type == TYPE_UINT || numBits == 32) ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			deUint32		expectedValue	= m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				expectedValue |= inputValue;
			}

			if ((groupOutput & compareMask) != (expectedValue & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expectedValue) << ", got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((compareMask & (outputValue & m_initialValue)) == 0)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}